

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow *parent_window)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ImGuiWindow **ppIVar5;
  ImGuiWindow *window;
  ImGuiWindow *pIStack_20;
  int i;
  ImGuiWindow *bottom_most_visible_window;
  ImGuiContext *g;
  ImGuiWindow *parent_window_local;
  
  pIVar1 = GImGui;
  window._4_4_ = FindWindowDisplayIndex(parent_window);
  pIStack_20 = parent_window;
  do {
    if (window._4_4_ < 0) {
      return pIStack_20;
    }
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,window._4_4_);
    window_00 = *ppIVar5;
    if ((window_00->Flags & 0x1000000U) == 0) {
      bVar2 = IsWindowWithinBeginStackOf(window_00,parent_window);
      if (!bVar2) {
        return pIStack_20;
      }
      bVar2 = IsWindowActiveAndVisible(window_00);
      if (bVar2) {
        iVar3 = GetWindowDisplayLayer(window_00);
        iVar4 = GetWindowDisplayLayer(parent_window);
        if (iVar3 <= iVar4) {
          pIStack_20 = window_00;
        }
      }
    }
    window._4_4_ = window._4_4_ + -1;
  } while( true );
}

Assistant:

ImGuiWindow* ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow* parent_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* bottom_most_visible_window = parent_window;
    for (int i = FindWindowDisplayIndex(parent_window); i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
            continue;
        if (!IsWindowWithinBeginStackOf(window, parent_window))
            break;
        if (IsWindowActiveAndVisible(window) && GetWindowDisplayLayer(window) <= GetWindowDisplayLayer(parent_window))
            bottom_most_visible_window = window;
    }
    return bottom_most_visible_window;
}